

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::_::CoroutineBase::traceEvent(CoroutineBase *this,TraceBuilder *builder)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *pOVar1;
  PromiseNode *pPVar2;
  void **ppvVar3;
  Event *pEVar4;
  
  pOVar1 = (this->promiseNodeForTrace).ptr;
  if (pOVar1 != (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)0x0) {
    pPVar2 = pOVar1->ptr;
    (*(pPVar2->super_PromiseArenaMember)._vptr_PromiseArenaMember[4])(pPVar2,builder,1);
  }
  ppvVar3 = builder->current;
  if (ppvVar3 < builder->limit) {
    builder->current = ppvVar3 + 1;
    *ppvVar3 = std::__n4861::coroutine_handle<void>::operator();
  }
  pEVar4 = (this->onReadyEvent).event;
  if ((pEVar4 != (Event *)0x0) && (builder->current != builder->limit)) {
    (**pEVar4->_vptr_Event)(pEVar4,builder);
    return;
  }
  return;
}

Assistant:

void CoroutineBase::traceEvent(TraceBuilder& builder) {
  KJ_IF_SOME(promise, promiseNodeForTrace) {
    promise->tracePromise(builder, true);
  }

  // Maybe returning the address of coroutine() will give us a function name with meaningful type
  // information. (Narrator: It doesn't.)
  builder.add(GetFunctorStartAddress<>::apply(coroutine));

  onReadyEvent.traceEvent(builder);
}